

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::TypedAttribute
          (TypedAttribute<Imath_3_2::Matrix33<float>_> *this,Matrix33<float> *value)

{
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e3868;
  Imath_3_2::Matrix33<float>::Matrix33(&this->_value,value);
  return;
}

Assistant:

TypedAttribute<T>::TypedAttribute (const T& value)
    : Attribute (), _value (value)
{
    // empty
}